

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O1

ConstantRange __thiscall slang::ConstantRange::subrange(ConstantRange *this,ConstantRange select)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ConstantRange CVar5;
  int iVar6;
  ConstantRange CVar7;
  int iVar8;
  
  iVar1 = this->left;
  iVar2 = this->right;
  iVar3 = iVar1;
  if (iVar2 < iVar1) {
    iVar3 = iVar2;
  }
  iVar6 = select.right;
  iVar8 = select.left;
  iVar4 = iVar8;
  if (iVar6 < iVar8) {
    iVar4 = iVar6;
  }
  if (iVar8 <= iVar6) {
    iVar8 = iVar6;
  }
  CVar7.right = iVar8 + iVar3;
  CVar7.left = iVar4 + iVar3;
  CVar5.right = iVar4 + iVar3;
  CVar5.left = iVar8 + iVar3;
  if (iVar2 <= iVar1) {
    CVar5 = CVar7;
  }
  return CVar5;
}

Assistant:

ConstantRange ConstantRange::subrange(ConstantRange select) const {
    int32_t l = lower();
    ConstantRange result;
    result.left = select.lower() + l;
    result.right = select.upper() + l;

    SLANG_ASSERT(result.right <= upper());
    if (isLittleEndian())
        return result;
    else
        return result.reverse();
}